

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

void __thiscall delta_complex_t::add_edge(delta_complex_t *this,index_t i,index_t j,value_t val)

{
  iterator iVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pdVar5;
  pointer pvVar6;
  mapped_type *pmVar7;
  pointer pvVar8;
  pointer plVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  initializer_list<long> __l;
  initializer_list<long> __l_00;
  initializer_list<long> __l_01;
  initializer_list<long> __l_02;
  initializer_list<long> __l_03;
  index_t loc;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  new_orient;
  allocator_type local_209;
  long local_208;
  value_t local_1fc;
  long local_1f8;
  long local_1f0;
  index_t local_1e8;
  index_t local_1e0;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_1d8;
  vector<long,_std::allocator<long>_> local_1c0;
  vector<long,_std::allocator<long>_> local_1a8;
  vector<long,_std::allocator<long>_> local_190;
  vector<long,_std::allocator<long>_> local_178;
  vector<long,_std::allocator<long>_> local_160;
  undefined1 local_148 [64];
  pointer local_108;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_100 [2];
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c8;
  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_98;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_60;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_48;
  
  pvVar8 = (this->cells).
           super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_208 = ((long)*(pointer *)
                      ((long)&pvVar8[1].
                              super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                              ._M_impl + 8) -
               *(long *)&pvVar8[1].
                         super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                         ._M_impl >> 3) * 0x34f72c234f72c235;
  local_1d8.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (vector<long,_std::allocator<long>_> *)0x0;
  local_1d8.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._16_8_ = (pointer)0x0;
  local_148._0_8_ = (pointer)0x0;
  local_148._8_8_ = (pointer)0x0;
  local_1fc = val;
  local_1f8 = j;
  local_1f0 = i;
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::emplace_back<std::vector<long,std::allocator<long>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&local_1d8,(vector<long,_std::allocator<long>_> *)local_148);
  if ((pointer)local_148._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
  }
  if (i < j) {
    local_148._0_8_ = (pointer)0x1;
    iVar1._M_current =
         ((local_1d8.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        ((local_1d8.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (local_1d8.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,iVar1,(long *)local_148);
    }
    else {
      *iVar1._M_current = 1;
      ((local_1d8.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<long,_std::allocator<long>_>)
      ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    pvVar8 = (this->cells).
             super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __l._M_len = 2;
    __l._M_array = &local_1e8;
    local_1e8 = i;
    local_1e0 = j;
    std::vector<long,_std::allocator<long>_>::vector(&local_160,__l,&local_209);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector(&local_48,&local_1d8);
    delta_complex_cell_t::delta_complex_cell_t
              ((delta_complex_cell_t *)local_148,&local_160,&local_48,local_1fc,local_208);
    std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
    emplace_back<delta_complex_cell_t>(pvVar8 + 1,(delta_complex_cell_t *)local_148);
    std::
    _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_98);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_c8);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(local_100);
    if ((pointer)local_148._48_8_ != (pointer)0x0) {
      operator_delete((void *)local_148._48_8_,(long)local_108 - local_148._48_8_);
    }
    if ((pointer)local_148._24_8_ != (pointer)0x0) {
      operator_delete((void *)local_148._24_8_,local_148._40_8_ - local_148._24_8_);
    }
    if ((pointer)local_148._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
    }
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(&local_48);
    if (local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pvVar6 = (this->cliques).
             super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = *(pointer *)
              ((long)&pvVar6[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                      super__Vector_impl_data + 8);
    lVar11 = *(long *)&pvVar6[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                       super__Vector_impl_data;
    __l_00._M_len = 2;
    __l_00._M_array = &local_1e8;
    local_1e8 = i;
    local_1e0 = j;
    std::vector<long,_std::allocator<long>_>::vector(&local_178,__l_00,&local_209);
    plVar9 = (pointer)(((long)pcVar2 - lVar11 >> 4) * 0x6db6db6db6db6db7);
    clique_t::clique_t((clique_t *)local_148,&local_178,(index_t)plVar9);
    std::vector<clique_t,_std::allocator<clique_t>_>::emplace_back<clique_t>
              (pvVar6 + 1,(clique_t *)local_148);
    std::
    _Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_148 + 0x38));
    if ((pointer)local_148._24_8_ != (pointer)0x0) {
      operator_delete((void *)local_148._24_8_,local_148._40_8_ - local_148._24_8_);
    }
    if ((pointer)local_148._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
    }
    if (local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pvVar6 = (this->cliques).
             super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = *(pointer *)
              ((long)&pvVar6[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                      super__Vector_impl_data + 8);
    iVar1._M_current =
         *(pointer *)
          ((long)&pcVar2[-1].faces.super__Vector_base<long,_std::allocator<long>_>._M_impl + 8);
    if (iVar1._M_current ==
        *(pointer *)
         ((long)&pcVar2[-1].faces.super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10)) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                ((vector<long,std::allocator<long>> *)(pcVar2 + -1),iVar1,&local_208);
      pvVar6 = (this->cliques).
               super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      *iVar1._M_current = local_208;
      *(long **)((long)&pcVar2[-1].faces.super__Vector_base<long,_std::allocator<long>_>._M_impl + 8
                ) = iVar1._M_current + 1;
    }
    local_148._0_8_ = j;
    local_148._8_8_ = plVar9;
    std::
    _Hashtable<long,std::pair<long_const,long>,std::allocator<std::pair<long_const,long>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<long,long>>
              ((_Hashtable<long,std::pair<long_const,long>,std::allocator<std::pair<long_const,long>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(*(long *)&(pvVar6->super__Vector_base<clique_t,_std::allocator<clique_t>_>).
                             _M_impl.super__Vector_impl_data + i * 0x70 + 0x38));
  }
  else {
    local_148._0_8_ = (pointer)0x0;
    iVar1._M_current =
         ((local_1d8.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        ((local_1d8.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (local_1d8.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,iVar1,(long *)local_148);
    }
    else {
      *iVar1._M_current = 0;
      ((local_1d8.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<long,_std::allocator<long>_>)
      ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    pvVar8 = (this->cells).
             super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __l_01._M_len = 2;
    __l_01._M_array = &local_1e8;
    local_1e8 = j;
    local_1e0 = i;
    std::vector<long,_std::allocator<long>_>::vector(&local_190,__l_01,&local_209);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector(&local_60,&local_1d8);
    delta_complex_cell_t::delta_complex_cell_t
              ((delta_complex_cell_t *)local_148,&local_190,&local_60,local_1fc,local_208);
    std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
    emplace_back<delta_complex_cell_t>(pvVar8 + 1,(delta_complex_cell_t *)local_148);
    std::
    _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_98);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_c8);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(local_100);
    if ((pointer)local_148._48_8_ != (pointer)0x0) {
      operator_delete((void *)local_148._48_8_,(long)local_108 - local_148._48_8_);
    }
    if ((pointer)local_148._24_8_ != (pointer)0x0) {
      operator_delete((void *)local_148._24_8_,local_148._40_8_ - local_148._24_8_);
    }
    if ((pointer)local_148._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
    }
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(&local_60);
    if (local_190.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_190.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_190.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    __l_02._M_len = 2;
    __l_02._M_array = (iterator)local_148;
    local_148._0_8_ = j;
    local_148._8_8_ = i;
    std::vector<long,_std::allocator<long>_>::vector(&local_1a8,__l_02,(allocator_type *)&local_1e8)
    ;
    plVar9 = (pointer)get_clique(this,&local_1a8);
    if (local_1a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (plVar9 == (pointer)0xffffffffffffffff) {
      pvVar6 = (this->cliques).
               super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = *(pointer *)
                ((long)&pvVar6[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                        super__Vector_impl_data + 8);
      lVar11 = *(long *)&pvVar6[1].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                         super__Vector_impl_data;
      __l_03._M_len = 2;
      __l_03._M_array = &local_1e8;
      local_1e8 = j;
      local_1e0 = i;
      std::vector<long,_std::allocator<long>_>::vector(&local_1c0,__l_03,&local_209);
      plVar9 = (pointer)(((long)pcVar2 - lVar11 >> 4) * 0x6db6db6db6db6db7);
      clique_t::clique_t((clique_t *)local_148,&local_1c0,(index_t)plVar9);
      std::vector<clique_t,_std::allocator<clique_t>_>::emplace_back<clique_t>
                (pvVar6 + 1,(clique_t *)local_148);
      std::
      _Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(local_148 + 0x38));
      if ((pointer)local_148._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_148._24_8_,local_148._40_8_ - local_148._24_8_);
      }
      if ((pointer)local_148._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
      }
      if (local_1c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_148._0_8_ = i;
      local_148._8_8_ = plVar9;
      std::
      _Hashtable<long,std::pair<long_const,long>,std::allocator<std::pair<long_const,long>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<long,long>>
                ((_Hashtable<long,std::pair<long_const,long>,std::allocator<std::pair<long_const,long>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)(*(long *)&(((this->cliques).
                                 super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<clique_t,_std::allocator<clique_t>_>)._M_impl.
                               super__Vector_impl_data + j * 0x70 + 0x38));
    }
    lVar11 = *(long *)&(this->cliques).
                       super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                       super__Vector_impl_data;
    lVar10 = (long)plVar9 * 0x70;
    iVar1._M_current = *(long **)(lVar11 + 8 + lVar10);
    if (iVar1._M_current == *(long **)(lVar11 + 0x10 + lVar10)) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                ((vector<long,std::allocator<long>> *)(lVar11 + lVar10),iVar1,&local_208);
    }
    else {
      *iVar1._M_current = local_208;
      *(long **)((vector<long,std::allocator<long>> *)(lVar11 + lVar10) + 8) = iVar1._M_current + 1;
    }
  }
  lVar11 = *(long *)&(((this->cells).
                       super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                     )._M_impl;
  lVar10 = i * 0xe8;
  local_148._0_8_ = j;
  std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
  _M_insert_unique<long_const&>
            ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
             (lVar10 + lVar11 + 0x80),(long *)local_148);
  lVar11 = lVar11 + lVar10;
  uVar3 = *(ulong *)(lVar11 + 0xa8);
  uVar4 = *(ulong *)(lVar11 + 200);
  pmVar7 = std::__detail::
           _Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(lVar11 + 0xb0),(key_type *)local_148);
  *pmVar7 = (uint)(uVar3 <= uVar4) * 2;
  lVar11 = *(long *)&(((this->cells).
                       super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                     )._M_impl;
  lVar12 = j * 0xe8;
  local_148._0_8_ = i;
  std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
  _M_insert_unique<long_const&>
            ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
             (lVar12 + lVar11 + 0x80),(long *)local_148);
  lVar11 = lVar11 + lVar12;
  uVar3 = *(ulong *)(lVar11 + 0xa8);
  uVar4 = *(ulong *)(lVar11 + 200);
  pmVar7 = std::__detail::
           _Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(lVar11 + 0xb0),(key_type *)local_148);
  *pmVar7 = 2 - (uint)(uVar4 < uVar3);
  pvVar8 = (this->cells).
           super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = *(long *)&(pvVar8->
                     super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                     )._M_impl;
  iVar1._M_current = *(long **)(lVar11 + 8 + lVar10);
  if (iVar1._M_current == *(long **)(lVar11 + 0x10 + lVar10)) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)(lVar11 + lVar10),iVar1,&local_208);
    pvVar8 = (this->cells).
             super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = *(long *)&(pvVar8->
                       super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                       )._M_impl;
  }
  else {
    *iVar1._M_current = local_208;
    *(long **)((vector<long,std::allocator<long>> *)(lVar11 + lVar10) + 8) = iVar1._M_current + 1;
  }
  iVar1._M_current = *(long **)(lVar11 + 8 + lVar12);
  if (iVar1._M_current == *(long **)(lVar11 + 0x10 + lVar12)) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)(lVar11 + lVar12),iVar1,&local_208);
    pvVar8 = (this->cells).
             super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    *iVar1._M_current = local_208;
    *(long **)((vector<long,std::allocator<long>> *)(lVar11 + lVar12) + 8) = iVar1._M_current + 1;
  }
  pdVar5 = *(pointer *)
            ((long)&pvVar8[1].
                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
                    _M_impl + 8);
  iVar1._M_current =
       *(pointer *)((long)&pdVar5[-1].boundary.super__Vector_base<long,_std::allocator<long>_> + 8);
  if (iVar1._M_current ==
      *(pointer *)
       ((long)&pdVar5[-1].boundary.super__Vector_base<long,_std::allocator<long>_> + 0x10)) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)&pdVar5[-1].boundary,iVar1,&local_1f0);
    pvVar8 = (this->cells).
             super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    *iVar1._M_current = local_1f0;
    *(long **)((long)&pdVar5[-1].boundary.super__Vector_base<long,_std::allocator<long>_> + 8) =
         iVar1._M_current + 1;
  }
  pdVar5 = *(pointer *)
            ((long)&pvVar8[1].
                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
                    _M_impl + 8);
  iVar1._M_current =
       *(pointer *)((long)&pdVar5[-1].boundary.super__Vector_base<long,_std::allocator<long>_> + 8);
  if (iVar1._M_current ==
      *(pointer *)
       ((long)&pdVar5[-1].boundary.super__Vector_base<long,_std::allocator<long>_> + 0x10)) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)&pdVar5[-1].boundary,iVar1,&local_1f8);
  }
  else {
    *iVar1._M_current = local_1f8;
    *(long **)((long)&pdVar5[-1].boundary.super__Vector_base<long,_std::allocator<long>_> + 8) =
         iVar1._M_current + 1;
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&local_1d8);
  return;
}

Assistant:

void add_edge(index_t i,index_t j,value_t val){
		//NOTE: We assume edges are added in increasing lexicographic order,
		//this avoids always checking if relevant 2-clique already in list
		//This could be changed and it would make the code easier to read,
		//But I think it is slightly faster this way, though probably a negligible amount
		index_t loc = cells[1].size();
		std::vector<std::vector<index_t>> new_orient;
		new_orient.push_back(std::vector<index_t>());
		if( i < j ){
			//When i < j create a new clique and a new face, with edge orientation 1
			//add the new face to the new clique and also add the cofaces to the clique
			new_orient[0].push_back(1);
			cells[1].push_back(delta_complex_cell_t(std::vector<index_t>{i,j},new_orient,val,loc));
			index_t cli_loc = cliques[1].size();
			cliques[1].push_back(clique_t(std::vector<index_t>{i,j},cli_loc));
			cliques[1].back().faces.push_back(loc);
			cliques[0][i].add_coface(j,cli_loc);
		} else{
			//When i > j  create a new face with orientation 0
			//then check if the clique already exists, if it does not then create it
			//then add the new face the the clique
			new_orient[0].push_back(0);
			cells[1].push_back(delta_complex_cell_t(std::vector<index_t>{j,i},new_orient,val,loc));
			index_t the_cli = get_clique(std::vector<index_t>{j,i});
			if(the_cli == -1){
				index_t cli_loc = cliques[1].size();
				cliques[1].push_back(clique_t(std::vector<index_t>{j,i},cli_loc));
				cliques[0][j].add_coface(i,cli_loc);
				the_cli = cli_loc;
			}
			cliques[1][the_cli].faces.push_back(loc);
		}
		//Add the relevent neighbour and coboundary information to the vertices
		cells[0][i].add_neighbour(j,0);
		cells[0][j].add_neighbour(i,1);
		cells[0][i].coboundary.push_back(loc);
		cells[0][j].coboundary.push_back(loc);
		//Add the vertices of faces of the new created face
		cells[1].back().boundary.push_back(i);
		cells[1].back().boundary.push_back(j);
	}